

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t __thiscall
duckdb::HexHugeIntOperator::Operation<duckdb::hugeint_t,duckdb::string_t>
          (HexHugeIntOperator *this,hugeint_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  idx_t iVar2;
  long lVar3;
  char *pcVar4;
  uint64_t lower;
  int64_t upper;
  ulong uVar5;
  undefined1 auVar6 [16];
  string_t target;
  
  iVar2 = CountZeros<duckdb::hugeint_t>::Leading((CountZeros<duckdb::hugeint_t> *)this,input);
  uVar5 = iVar2 >> 2;
  if (uVar5 == 0x20) {
    auVar6 = duckdb::StringVector::EmptyString((Vector *)input.upper,1);
    target.value.pointer.ptr = (char *)auVar6._8_8_;
    target.value._0_8_ = auVar6._0_8_;
    pcVar4 = target.value.pointer.ptr;
    if (auVar6._0_4_ < 0xd) {
      pcVar4 = target.value.pointer.prefix;
    }
    *pcVar4 = '0';
  }
  else {
    auVar6 = duckdb::StringVector::EmptyString((Vector *)input.upper,0x20 - uVar5);
    target.value.pointer.ptr = (char *)auVar6._8_8_;
    target.value._0_8_ = auVar6._0_8_;
    pcVar4 = target.value.pointer.ptr;
    if (auVar6._0_4_ < 0xd) {
      pcVar4 = target.value.pointer.prefix;
    }
    for (lVar3 = uVar5 * -4 + 0x7c; 0x43 < lVar3 + 4U; lVar3 = lVar3 + -4) {
      *pcVar4 = "0123456789ABCDEF"[(uint)((long)input.lower >> ((byte)lVar3 & 0x3f)) & 0xf];
      pcVar4 = pcVar4 + 1;
    }
    for (; lVar3 != -4; lVar3 = lVar3 + -4) {
      *pcVar4 = "0123456789ABCDEF"[(uint)((ulong)this >> ((byte)lVar3 & 0x3f)) & 0xf];
      pcVar4 = pcVar4 + 1;
    }
  }
  string_t::Finalize(&target);
  aVar1.pointer.ptr = target.value.pointer.ptr;
  aVar1._0_8_ = target.value._0_8_;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		idx_t num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<hugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 2 - (num_leading_zero / 4);

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntHexBytes<hugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}